

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_args.c
# Opt level: O3

REF_STATUS ref_args_find(REF_INT n,char **args,char *target,REF_INT *pos)

{
  int iVar1;
  ulong uVar2;
  
  *pos = -1;
  if (0 < n) {
    uVar2 = 0;
    do {
      iVar1 = strcmp(target,args[uVar2]);
      if (iVar1 == 0) {
        *pos = (REF_INT)uVar2;
        return 0;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_args_find(REF_INT n, char **args, const char *target,
                                 REF_INT *pos) {
  REF_INT i;

  *pos = REF_EMPTY;

  for (i = 0; i < n; i++) {
    if (0 == strcmp(target, args[i])) {
      *pos = i;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}